

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLimit::ChLinkLimit(ChLinkLimit *this)

{
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->constr_upper);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->constr_lower);
  this->m_active = false;
  this->m_penalty_only = false;
  this->m_polar = false;
  this->m_rotation = false;
  this->m_max = 1.0;
  this->m_min = (double)&DAT_bff0000000000000;
  this->m_maxCushion = (double)SUB168(ZEXT816(0) << 0x20,0);
  this->m_minCushion = (double)SUB168(ZEXT816(0) << 0x20,8);
  this->m_Kmax = 1000.0;
  this->m_Kmin = 1000.0;
  this->m_Rmax = 100.0;
  this->m_Rmin = 100.0;
  this->m_maxElastic = 0.0;
  this->m_minElastic = 0.0;
  (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Kmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmax_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_Rmin_modul).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_polarMax_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_polarMax_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_28);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_Kmax_modul,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_28);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_Kmin_modul,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_28);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_Rmax_modul,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_28);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_Rmin_modul,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_28);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_polarMax_funct,
             &local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  (this->constr_upper).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_UNILATERAL;
  ChConstraint::UpdateActiveFlag((ChConstraint *)this);
  (this->constr_lower).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_UNILATERAL;
  ChConstraint::UpdateActiveFlag((ChConstraint *)&this->constr_lower);
  return;
}

Assistant:

ChLinkLimit::ChLinkLimit()
    : m_active(false),
      m_penalty_only(false),
      m_polar(false),
      m_rotation(false),
      m_max(1),
      m_min(-1),
      m_maxCushion(0),
      m_minCushion(0),
      m_Kmax(1000),
      m_Kmin(1000),
      m_Rmax(100),
      m_Rmin(100),
      m_minElastic(0),
      m_maxElastic(0) {
    // Default: no modulation
    m_Kmax_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_Kmin_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_Rmax_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_Rmin_modul = chrono_types::make_shared<ChFunction_Const>(1);
    m_polarMax_funct = chrono_types::make_shared<ChFunction_Const>(1);

    constr_upper.SetMode(CONSTRAINT_UNILATERAL);
    constr_lower.SetMode(CONSTRAINT_UNILATERAL);
}